

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConveyor.cpp
# Opt level: O2

void __thiscall chrono::ChConveyor::ArchiveOUT(ChConveyor *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChLinkLockLock_*> local_78;
  ChNameValue<chrono::ChBody_*> local_60;
  ChNameValue<chrono::ChBody_*> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChConveyor>(marchive);
  ChPhysicsItem::ArchiveOUT(&this->super_ChPhysicsItem,marchive);
  local_30._value = &this->conveyor_speed;
  local_30._name = "conveyor_speed";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->conveyor_truss;
  local_48._name = "conveyor_truss";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->conveyor_plate;
  local_60._name = "conveyor_plate";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  local_78._value = &this->internal_link;
  local_78._name = "internal_link";
  local_78._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_78);
  return;
}

Assistant:

void ChConveyor::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChConveyor>();

    // serialize parent class
    ChPhysicsItem::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(conveyor_speed);
    marchive << CHNVP(conveyor_truss);
    marchive << CHNVP(conveyor_plate);
    marchive << CHNVP(internal_link);
}